

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  stbi_uc *psVar1;
  int a;
  int b;
  stbi__uint32 b_00;
  stbi__context *s;
  byte bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  stbi__uint32 sVar11;
  uint uVar12;
  int iVar13;
  stbi_uc *psVar14;
  byte *pbVar15;
  void *pvVar16;
  ulong uVar17;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  int iVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  long in_R10;
  int *piVar22;
  int iVar23;
  long lVar24;
  ushort uVar25;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar26 [32];
  
  s = z->s;
  uVar9 = stbi__get16be(s);
  if (uVar9 < 0xb) {
LAB_0010d969:
    stbi__g_failure_reason = "bad SOF len";
  }
  else {
    psVar14 = s->img_buffer;
    if (psVar14 < s->img_buffer_end) {
LAB_0010d9e5:
      s->img_buffer = psVar14 + 1;
      if (*psVar14 == '\b') {
        sVar11 = stbi__get16be(s);
        s->img_y = sVar11;
        if (sVar11 == 0) {
          stbi__g_failure_reason = "no header height";
          return 0;
        }
        sVar11 = stbi__get16be(s);
        s->img_x = sVar11;
        if (sVar11 == 0) {
          stbi__g_failure_reason = "0 width";
          return 0;
        }
        pbVar15 = s->img_buffer;
        if (pbVar15 < s->img_buffer_end) {
LAB_0010daa9:
          s->img_buffer = pbVar15 + 1;
          bVar8 = *pbVar15;
        }
        else {
          if (s->read_from_callbacks != 0) {
            psVar14 = s->buffer_start;
            iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
            if (iVar10 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar14;
              s->img_buffer_end = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar14;
              s->img_buffer_end = psVar14 + iVar10;
            }
            pbVar15 = s->img_buffer;
            goto LAB_0010daa9;
          }
          bVar8 = 0;
        }
        if ((4 < bVar8) || ((0x1aU >> (bVar8 & 0x1f) & 1) == 0)) {
          stbi__g_failure_reason = "bad component count";
          return 0;
        }
        s->img_n = (uint)bVar8;
        if (bVar8 != 0) {
          uVar17 = (ulong)(bVar8 + 7 & 0xfffffff8);
          auVar29 = vpbroadcastq_avx512f();
          auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar31 = vpbroadcastq_avx512f(ZEXT816(0x60));
          auVar32 = vpbroadcastq_avx512f();
          auVar33 = vpbroadcastq_avx512f(ZEXT816(8));
          do {
            uVar6 = vpcmpuq_avx512f(auVar30,auVar29,2);
            auVar34 = vpmullq_avx512dq(auVar30,auVar31);
            auVar34 = vpaddq_avx512f(auVar32,auVar34);
            vpscatterqq_avx512f(ZEXT864(0x30) + auVar34,uVar6,ZEXT1664((undefined1  [16])0x0));
            vpscatterqq_avx512f(ZEXT864(0x48) + auVar34,uVar6,ZEXT1664((undefined1  [16])0x0));
            auVar30 = vpaddq_avx512f(auVar30,auVar33);
            uVar17 = uVar17 - 8;
          } while (uVar17 != 0);
        }
        if (uVar9 == (uint)bVar8 * 3 + 8) {
          z->rgb = 0;
          uVar17 = (ulong)(uint)s->img_n;
          if (0 < s->img_n) {
            psVar14 = s->buffer_start;
            psVar1 = s->buffer_start + 1;
            piVar22 = &z->img_comp[0].tq;
            lVar24 = 0;
            do {
              pbVar15 = s->img_buffer;
              if (pbVar15 < s->img_buffer_end) {
LAB_0010dbfc:
                s->img_buffer = pbVar15 + 1;
                bVar8 = *pbVar15;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
                  if (iVar10 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar14;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar14;
                    s->img_buffer_end = psVar14 + iVar10;
                  }
                  pbVar15 = s->img_buffer;
                  goto LAB_0010dbfc;
                }
                bVar8 = 0;
              }
              ((anon_struct_96_18_0d0905d3 *)(piVar22 + -3))->id = (uint)bVar8;
              if ((s->img_n == 3) && (bVar8 == "RGB"[lVar24])) {
                z->rgb = z->rgb + 1;
              }
              pbVar15 = s->img_buffer;
              if (pbVar15 < s->img_buffer_end) {
LAB_0010dc9b:
                s->img_buffer = pbVar15 + 1;
                bVar8 = *pbVar15;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
                  if (iVar10 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar14;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar14;
                    s->img_buffer_end = psVar14 + iVar10;
                  }
                  pbVar15 = s->img_buffer;
                  goto LAB_0010dc9b;
                }
                bVar8 = 0;
              }
              piVar22[-2] = (uint)(bVar8 >> 4);
              if ((byte)(bVar8 + 0xb0) < 0xc0) {
                stbi__g_failure_reason = "bad H";
                return 0;
              }
              piVar22[-1] = bVar8 & 0xf;
              if ((bVar8 & 0xf) - 5 < 0xfffffffc) {
                stbi__g_failure_reason = "bad V";
                return 0;
              }
              pbVar15 = s->img_buffer;
              if (pbVar15 < s->img_buffer_end) {
LAB_0010dd45:
                s->img_buffer = pbVar15 + 1;
                bVar8 = *pbVar15;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
                  if (iVar10 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar14;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar14;
                    s->img_buffer_end = psVar14 + iVar10;
                  }
                  pbVar15 = s->img_buffer;
                  goto LAB_0010dd45;
                }
                bVar8 = 0;
              }
              *piVar22 = (uint)bVar8;
              if (3 < bVar8) {
                stbi__g_failure_reason = "bad TQ";
                return 0;
              }
              lVar24 = lVar24 + 1;
              uVar17 = (ulong)s->img_n;
              piVar22 = piVar22 + 0x18;
            } while (lVar24 < (long)uVar17);
          }
          if (scan != 0) {
            return 1;
          }
          sVar11 = s->img_x;
          b_00 = s->img_y;
          iVar13 = (int)uVar17;
          iVar10 = stbi__mad3sizes_valid(sVar11,b_00,iVar13,0);
          if (iVar10 == 0) {
            stbi__g_failure_reason = "too large";
            return 0;
          }
          uVar21 = 1;
          uVar19 = 1;
          if (0 < iVar13) {
            uVar19 = (ulong)(iVar13 + 0xfU & 0xfffffff0);
            auVar29 = vpbroadcastq_avx512f();
            auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar32 = vpbroadcastd_avx512f(ZEXT416(1));
            auVar33 = vpbroadcastq_avx512f(ZEXT816(0x60));
            auVar34 = vpbroadcastq_avx512f();
            auVar35 = vpbroadcastq_avx512f(ZEXT816(0x10));
            auVar36 = vmovdqa64_avx512f(auVar32);
            do {
              auVar37 = vmovdqa64_avx512f(auVar36);
              auVar38 = vmovdqa64_avx512f(auVar32);
              uVar21 = vpcmpuq_avx512f(auVar31,auVar29,2);
              uVar7 = vpcmpuq_avx512f(auVar30,auVar29,2);
              auVar32 = vpmullq_avx512dq(auVar31,auVar33);
              vpaddq_avx512f(auVar34,auVar32);
              auVar32 = vpmullq_avx512dq(auVar30,auVar33);
              vpaddq_avx512f(auVar34,auVar32);
              auVar26 = vpgatherqd_avx512f(*(undefined8 *)(in_R10 + 4));
              bVar8 = (byte)uVar7;
              auVar27._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar26._4_4_;
              auVar27._0_4_ = (uint)(bVar8 & 1) * auVar26._0_4_;
              auVar27._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar26._8_4_;
              auVar27._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar26._12_4_;
              auVar27._16_4_ = (uint)((byte)(uVar7 >> 4) & 1) * auVar26._16_4_;
              auVar27._20_4_ = (uint)((byte)(uVar7 >> 5) & 1) * auVar26._20_4_;
              auVar27._24_4_ = (uint)((byte)(uVar7 >> 6) & 1) * auVar26._24_4_;
              auVar27._28_4_ = (uint)(byte)(uVar7 >> 7) * auVar26._28_4_;
              auVar26 = vpgatherqd_avx512f(CONCAT44(_DAT_00000009,_DAT_00000005));
              bVar2 = (byte)uVar21;
              auVar32 = vinserti64x4_avx512f
                                  (ZEXT3264(CONCAT428((uint)(byte)(uVar21 >> 7) * auVar26._28_4_,
                                                      CONCAT424((uint)((byte)(uVar21 >> 6) & 1) *
                                                                auVar26._24_4_,
                                                                CONCAT420((uint)((byte)(uVar21 >> 5)
                                                                                & 1) *
                                                                          auVar26._20_4_,
                                                                          CONCAT416((uint)((byte)(
                                                  uVar21 >> 4) & 1) * auVar26._16_4_,
                                                  CONCAT412((uint)((byte)(uVar21 >> 3) & 1) *
                                                            auVar26._12_4_,
                                                            CONCAT48((uint)((byte)(uVar21 >> 2) & 1)
                                                                     * auVar26._8_4_,
                                                                     CONCAT44((uint)((byte)(uVar21 
                                                  >> 1) & 1) * auVar26._4_4_,
                                                  (uint)(bVar2 & 1) * auVar26._0_4_)))))))),auVar27,
                                   1);
              auVar36 = vpmaxsd_avx512f(auVar32,auVar37);
              auVar26 = vpgatherqd_avx512f(*(undefined8 *)(in_R10 + 8));
              auVar28._4_4_ = (uint)((byte)(uVar7 >> 1) & 1) * auVar26._4_4_;
              auVar28._0_4_ = (uint)(bVar8 & 1) * auVar26._0_4_;
              auVar28._8_4_ = (uint)((byte)(uVar7 >> 2) & 1) * auVar26._8_4_;
              auVar28._12_4_ = (uint)((byte)(uVar7 >> 3) & 1) * auVar26._12_4_;
              auVar28._16_4_ = (uint)((byte)(uVar7 >> 4) & 1) * auVar26._16_4_;
              auVar28._20_4_ = (uint)((byte)(uVar7 >> 5) & 1) * auVar26._20_4_;
              auVar28._24_4_ = (uint)((byte)(uVar7 >> 6) & 1) * auVar26._24_4_;
              auVar28._28_4_ = (uint)(byte)(uVar7 >> 7) * auVar26._28_4_;
              auVar26 = vpgatherqd_avx512f(CONCAT44(uRam000000000000000d,_DAT_00000009));
              auVar32 = vinserti64x4_avx512f
                                  (ZEXT3264(CONCAT428((uint)(byte)(uVar21 >> 7) * auVar26._28_4_,
                                                      CONCAT424((uint)((byte)(uVar21 >> 6) & 1) *
                                                                auVar26._24_4_,
                                                                CONCAT420((uint)((byte)(uVar21 >> 5)
                                                                                & 1) *
                                                                          auVar26._20_4_,
                                                                          CONCAT416((uint)((byte)(
                                                  uVar21 >> 4) & 1) * auVar26._16_4_,
                                                  CONCAT412((uint)((byte)(uVar21 >> 3) & 1) *
                                                            auVar26._12_4_,
                                                            CONCAT48((uint)((byte)(uVar21 >> 2) & 1)
                                                                     * auVar26._8_4_,
                                                                     CONCAT44((uint)((byte)(uVar21 
                                                  >> 1) & 1) * auVar26._4_4_,
                                                  (uint)(bVar2 & 1) * auVar26._0_4_)))))))),auVar28,
                                   1);
              auVar32 = vpmaxsd_avx512f(auVar32,auVar38);
              auVar31 = vpaddq_avx512f(auVar31,auVar35);
              auVar30 = vpaddq_avx512f(auVar30,auVar35);
              uVar19 = uVar19 - 0x10;
            } while (uVar19 != 0);
            uVar25 = CONCAT11(bVar8,bVar2);
            auVar29 = vmovdqa32_avx512f(auVar36);
            auVar30._0_4_ =
                 (uint)(bVar2 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar2 & 1) * auVar37._0_4_;
            bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar30._4_4_ = (uint)bVar3 * auVar29._4_4_ | (uint)!bVar3 * auVar37._4_4_;
            bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar30._8_4_ = (uint)bVar3 * auVar29._8_4_ | (uint)!bVar3 * auVar37._8_4_;
            bVar3 = (bool)((byte)(uVar25 >> 3) & 1);
            auVar30._12_4_ = (uint)bVar3 * auVar29._12_4_ | (uint)!bVar3 * auVar37._12_4_;
            bVar3 = (bool)((byte)(uVar25 >> 4) & 1);
            auVar30._16_4_ = (uint)bVar3 * auVar29._16_4_ | (uint)!bVar3 * auVar37._16_4_;
            bVar3 = (bool)((byte)(uVar25 >> 5) & 1);
            auVar30._20_4_ = (uint)bVar3 * auVar29._20_4_ | (uint)!bVar3 * auVar37._20_4_;
            bVar3 = (bool)((byte)(uVar25 >> 6) & 1);
            auVar30._24_4_ = (uint)bVar3 * auVar29._24_4_ | (uint)!bVar3 * auVar37._24_4_;
            bVar3 = (bool)((byte)(uVar25 >> 7) & 1);
            auVar30._28_4_ = (uint)bVar3 * auVar29._28_4_ | (uint)!bVar3 * auVar37._28_4_;
            auVar30._32_4_ =
                 (uint)(bVar8 & 1) * auVar29._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar37._32_4_;
            bVar3 = (bool)(bVar8 >> 1 & 1);
            auVar30._36_4_ = (uint)bVar3 * auVar29._36_4_ | (uint)!bVar3 * auVar37._36_4_;
            bVar3 = (bool)(bVar8 >> 2 & 1);
            auVar30._40_4_ = (uint)bVar3 * auVar29._40_4_ | (uint)!bVar3 * auVar37._40_4_;
            bVar3 = (bool)(bVar8 >> 3 & 1);
            auVar30._44_4_ = (uint)bVar3 * auVar29._44_4_ | (uint)!bVar3 * auVar37._44_4_;
            bVar3 = (bool)(bVar8 >> 4 & 1);
            auVar30._48_4_ = (uint)bVar3 * auVar29._48_4_ | (uint)!bVar3 * auVar37._48_4_;
            bVar3 = (bool)(bVar8 >> 5 & 1);
            auVar30._52_4_ = (uint)bVar3 * auVar29._52_4_ | (uint)!bVar3 * auVar37._52_4_;
            bVar3 = (bool)(bVar8 >> 6 & 1);
            auVar30._56_4_ = (uint)bVar3 * auVar29._56_4_ | (uint)!bVar3 * auVar37._56_4_;
            auVar30._60_4_ =
                 (uint)(bVar8 >> 7) * auVar29._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar37._60_4_;
            auVar29 = vmovdqa32_avx512f(auVar32);
            auVar31._0_4_ =
                 (uint)(bVar2 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar2 & 1) * auVar38._0_4_;
            bVar3 = (bool)((byte)(uVar25 >> 1) & 1);
            auVar31._4_4_ = (uint)bVar3 * auVar29._4_4_ | (uint)!bVar3 * auVar38._4_4_;
            bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
            auVar31._8_4_ = (uint)bVar3 * auVar29._8_4_ | (uint)!bVar3 * auVar38._8_4_;
            bVar3 = (bool)((byte)(uVar25 >> 3) & 1);
            auVar31._12_4_ = (uint)bVar3 * auVar29._12_4_ | (uint)!bVar3 * auVar38._12_4_;
            bVar3 = (bool)((byte)(uVar25 >> 4) & 1);
            auVar31._16_4_ = (uint)bVar3 * auVar29._16_4_ | (uint)!bVar3 * auVar38._16_4_;
            bVar3 = (bool)((byte)(uVar25 >> 5) & 1);
            auVar31._20_4_ = (uint)bVar3 * auVar29._20_4_ | (uint)!bVar3 * auVar38._20_4_;
            bVar3 = (bool)((byte)(uVar25 >> 6) & 1);
            auVar31._24_4_ = (uint)bVar3 * auVar29._24_4_ | (uint)!bVar3 * auVar38._24_4_;
            bVar3 = (bool)((byte)(uVar25 >> 7) & 1);
            auVar31._28_4_ = (uint)bVar3 * auVar29._28_4_ | (uint)!bVar3 * auVar38._28_4_;
            auVar31._32_4_ =
                 (uint)(bVar8 & 1) * auVar29._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar38._32_4_;
            bVar3 = (bool)(bVar8 >> 1 & 1);
            auVar31._36_4_ = (uint)bVar3 * auVar29._36_4_ | (uint)!bVar3 * auVar38._36_4_;
            bVar3 = (bool)(bVar8 >> 2 & 1);
            auVar31._40_4_ = (uint)bVar3 * auVar29._40_4_ | (uint)!bVar3 * auVar38._40_4_;
            bVar3 = (bool)(bVar8 >> 3 & 1);
            auVar31._44_4_ = (uint)bVar3 * auVar29._44_4_ | (uint)!bVar3 * auVar38._44_4_;
            bVar3 = (bool)(bVar8 >> 4 & 1);
            auVar31._48_4_ = (uint)bVar3 * auVar29._48_4_ | (uint)!bVar3 * auVar38._48_4_;
            bVar3 = (bool)(bVar8 >> 5 & 1);
            auVar31._52_4_ = (uint)bVar3 * auVar29._52_4_ | (uint)!bVar3 * auVar38._52_4_;
            bVar3 = (bool)(bVar8 >> 6 & 1);
            auVar31._56_4_ = (uint)bVar3 * auVar29._56_4_ | (uint)!bVar3 * auVar38._56_4_;
            auVar31._60_4_ =
                 (uint)(bVar8 >> 7) * auVar29._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar38._60_4_;
            auVar26 = vextracti64x4_avx512f(auVar31,1);
            auVar29 = vpmaxsd_avx512f(auVar31,ZEXT3264(auVar26));
            auVar4 = vpmaxsd_avx(auVar29._0_16_,auVar29._16_16_);
            auVar5 = vpshufd_avx(auVar4,0xee);
            auVar4 = vpmaxsd_avx(auVar4,auVar5);
            auVar5 = vpshufd_avx(auVar4,0x55);
            auVar4 = vpmaxsd_avx(auVar4,auVar5);
            uVar19 = (ulong)auVar4._0_4_;
            auVar26 = vextracti64x4_avx512f(auVar30,1);
            auVar29 = vpmaxsd_avx512f(auVar30,ZEXT3264(auVar26));
            auVar4 = vpmaxsd_avx(auVar29._0_16_,auVar29._16_16_);
            auVar5 = vpshufd_avx(auVar4,0xee);
            auVar4 = vpmaxsd_avx(auVar4,auVar5);
            auVar5 = vpshufd_avx(auVar4,0x55);
            auVar4 = vpmaxsd_avx(auVar4,auVar5);
            uVar21 = (ulong)auVar4._0_4_;
          }
          iVar20 = (int)uVar21;
          z->img_h_max = iVar20;
          iVar10 = (int)uVar19;
          z->img_v_max = iVar10;
          z->img_mcu_w = iVar20 * 8;
          z->img_mcu_h = iVar10 * 8;
          uVar9 = ((sVar11 - 1) + iVar20 * 8) / (uint)(iVar20 * 8);
          z->img_mcu_x = uVar9;
          uVar12 = ((b_00 - 1) + iVar10 * 8) / (uint)(iVar10 * 8);
          z->img_mcu_y = uVar12;
          if (iVar13 < 1) {
            return 1;
          }
          iVar13 = 1;
          lVar24 = 0;
          while( true ) {
            iVar18 = *(int *)((long)&z->img_comp[0].h + lVar24);
            iVar23 = *(int *)((long)&z->img_comp[0].v + lVar24);
            *(int *)((long)&z->img_comp[0].x + lVar24) =
                 (int)((iVar18 * sVar11 + iVar20 + -1) / uVar21);
            iVar18 = iVar18 * uVar9;
            a = iVar18 * 8;
            *(int *)((long)&z->img_comp[0].y + lVar24) =
                 (int)((iVar23 * b_00 + iVar10 + -1) / uVar19);
            *(int *)((long)&z->img_comp[0].w2 + lVar24) = a;
            iVar23 = iVar23 * uVar12;
            b = iVar23 * 8;
            *(int *)((long)&z->img_comp[0].h2 + lVar24) = b;
            pvVar16 = stbi__malloc_mad2(a,b,0xf);
            *(undefined1 (*) [16])((long)&z->img_comp[0].raw_coeff + lVar24) = (undefined1  [16])0x0
            ;
            *(undefined8 *)((long)&z->img_comp[0].coeff + lVar24) = 0;
            *(void **)((long)&z->img_comp[0].raw_data + lVar24) = pvVar16;
            why = extraout_EDX;
            if (pvVar16 == (void *)0x0) break;
            *(ulong *)((long)&z->img_comp[0].data + lVar24) =
                 (long)pvVar16 + 0xfU & 0xfffffffffffffff0;
            if (z->progressive != 0) {
              *(int *)((long)&z->img_comp[0].coeff_w + lVar24) = iVar18;
              *(int *)((long)&z->img_comp[0].coeff_h + lVar24) = iVar23;
              pvVar16 = stbi__malloc_mad3(a,b,2,0xf);
              *(void **)((long)&z->img_comp[0].raw_coeff + lVar24) = pvVar16;
              why = extraout_EDX_00;
              if (pvVar16 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].coeff + lVar24) =
                   (long)pvVar16 + 0xfU & 0xfffffffffffffff0;
            }
            iVar13 = iVar13 + 1;
            lVar24 = lVar24 + 0x60;
            if ((uVar17 & 0xffffffff) * 0x60 == lVar24) {
              return 1;
            }
          }
          stbi__g_failure_reason = "outofmem";
          stbi__free_jpeg_components(z,iVar13,why);
          return 0;
        }
        goto LAB_0010d969;
      }
    }
    else if (s->read_from_callbacks != 0) {
      psVar14 = s->buffer_start;
      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
      if (iVar10 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar14;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar14;
        s->img_buffer_end = psVar14 + iVar10;
      }
      psVar14 = s->img_buffer;
      goto LAB_0010d9e5;
    }
    stbi__g_failure_reason = "only 8-bit";
  }
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}